

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O0

void act_var_bump_global(sat_solver3 *s,int v)

{
  word wVar1;
  xdbl b;
  xdbl xVar2;
  xdbl xVar3;
  double dVar4;
  double dVar5;
  double act;
  int v_local;
  sat_solver3 *s_local;
  
  if ((s->pGlobalVars != (int *)0x0) && (s->pGlobalVars[v] != 0)) {
    if (s->VarActType == 0) {
      s->activity[v] = (long)((int)s->var_inc * 3) + s->activity[v];
      if ((s->activity[v] & 0x80000000) != 0) {
        act_var_rescale(s);
      }
      if (s->orderpos[v] != -1) {
        order_update(s,v);
      }
    }
    else if (s->VarActType == 1) {
      dVar4 = Abc_Word2Dbl(s->activity[v]);
      dVar5 = Abc_Word2Dbl(s->var_inc);
      dVar4 = dVar5 * 3.0 + dVar4;
      wVar1 = Abc_Dbl2Word(dVar4);
      s->activity[v] = wVar1;
      if (1e+100 < dVar4) {
        act_var_rescale(s);
      }
      if (s->orderpos[v] != -1) {
        order_update(s,v);
      }
    }
    else {
      if (s->VarActType != 2) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                      ,0x165,"void act_var_bump_global(sat_solver3 *, int)");
      }
      xVar3 = s->activity[v];
      xVar2 = s->var_inc;
      b = Xdbl_FromDouble(3.0);
      xVar2 = Xdbl_Mul(xVar2,b);
      xVar3 = Xdbl_Add(xVar3,xVar2);
      s->activity[v] = xVar3;
      if (0x14c924d692ca61b < s->activity[v]) {
        act_var_rescale(s);
      }
      if (s->orderpos[v] != -1) {
        order_update(s,v);
      }
    }
  }
  return;
}

Assistant:

static inline void act_var_bump_global(sat_solver3* s, int v) 
{
    if ( !s->pGlobalVars || !s->pGlobalVars[v] )
        return;
    if ( s->VarActType == 0 )
    {
        s->activity[v] += (int)((unsigned)s->var_inc * 3);
        if (s->activity[v] & 0x80000000)
            act_var_rescale(s);
        if (s->orderpos[v] != -1)
            order_update(s,v);
    }
    else if ( s->VarActType == 1 )
    {
        double act = Abc_Word2Dbl(s->activity[v]) + Abc_Word2Dbl(s->var_inc) * 3.0;
        s->activity[v] = Abc_Dbl2Word(act);
        if ( act > 1e100)
            act_var_rescale(s);
        if (s->orderpos[v] != -1)
            order_update(s,v);
    }
    else if ( s->VarActType == 2 )
    {
        s->activity[v] = Xdbl_Add( s->activity[v], Xdbl_Mul(s->var_inc, Xdbl_FromDouble(3.0)) );
        if (s->activity[v] > ABC_CONST(0x014c924d692ca61b))
            act_var_rescale(s);
        if (s->orderpos[v] != -1)
            order_update(s,v);
    }
    else assert( 0 );
}